

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMathCommon.h
# Opt level: O1

bool IntConstMath::Inc(IntConstType val,IRType type,IntConstType *result)

{
  bool bVar1;
  
  *result = val + 1;
  bVar1 = true;
  if (!SCARRY8(val,1)) {
    bVar1 = IsValid(val + 1,type);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool IntMathCommon<T>::Inc(T val, T *pResult)
{
#if __has_builtin(__builtin_add_overflow)
    return __builtin_add_overflow(val, 1, pResult);
#else
    *pResult = static_cast<T>(
        static_cast<UnsignedType>(val) + static_cast<UnsignedType>(1));
    // Overflow if result ends up less than input
    return *pResult <= val;
#endif
}